

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

uint case_hash(case_t_conflict el,void *arg)

{
  byte *pbVar1;
  uint64_t uVar2;
  
  if (el->case_node->code != N_CASE) {
    __assert_fail("el->case_node->code == N_CASE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x202e,"unsigned int case_hash(case_t, void *)");
  }
  pbVar1 = (byte *)((el->case_node->u).ops.head)->attr;
  if ((*pbVar1 & 1) != 0) {
    signed_integer_type_p(*(type **)(pbVar1 + 0x18));
    uVar2 = mir_hash(pbVar1 + 0x30,8,0x42);
    return (uint)uVar2;
  }
  __assert_fail("expr->const_p",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x2030,"unsigned int case_hash(case_t, void *)");
}

Assistant:

static unsigned case_hash (case_t el, void *arg MIR_UNUSED) {
  node_t case_expr = NL_HEAD (el->case_node->u.ops);
  struct expr *expr;

  assert (el->case_node->code == N_CASE);
  expr = case_expr->attr;
  assert (expr->const_p);
  if (signed_integer_type_p (expr->type))
    return (unsigned) mir_hash (&expr->c.i_val, sizeof (expr->c.i_val), 0x42);
  return (unsigned) mir_hash (&expr->c.u_val, sizeof (expr->c.u_val), 0x42);
}